

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::ValueRef::merge(ValueRef *this,ValueRef *other)

{
  VarScope *pVVar1;
  bool bVar2;
  NodeEqualChecker local_9;
  
  this->assigned = (bool)(this->assigned & other->assigned);
  pVVar1 = other->lastAssigneeScope;
  if ((this->lastAssigneeScope == (VarScope *)0x0) ||
     ((pVVar1 != (VarScope *)0x0 && (this->lastAssigneeScope->depth < pVVar1->depth)))) {
    this->lastAssigneeScope = pVVar1;
  }
  if (this->state == other->state) {
    if (this->info->kind == SK_VAR) {
      bVar2 = NodeEqualChecker::check
                        (&local_9,&this->expression->super_Node,&other->expression->super_Node);
      if (!bVar2) {
        kill(this,3,1);
      }
    }
    return;
  }
  kill(this,*(__pid_t *)(mergeMatrix + (ulong)this->state * 4 + (ulong)other->state * 0x1c),1);
  return;
}

Assistant:

void ValueRef::merge(const ValueRef *other) {

  assert(info == other->info);

  assigned &= other->assigned;
  if (lastAssigneeScope) {
    if (other->lastAssigneeScope && other->lastAssigneeScope->depth > lastAssigneeScope->depth)
      lastAssigneeScope = other->lastAssigneeScope;
  }
  else
  {
    lastAssigneeScope = other->lastAssigneeScope;
  }

  if (state != other->state) {
    enum ValueRefState k = mergeMatrix[other->state][state];
    kill(k);
    return;
  }

  if (isConstant()) {
    assert(other->isConstant());
    return;
  }

  if (!NodeEqualChecker().check(expression, other->expression)) {
    kill(VRS_MULTIPLE);
  }
}